

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O1

void amrex::printCell<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *mf,IntVect *cell,int comp,IntVect *ng)

{
  uint uVar1;
  ostringstream *this;
  int iVar2;
  int iVar3;
  int iVar4;
  FArrayBox *pFVar5;
  char cVar6;
  ostream *poVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  Box result;
  MFIter mfi;
  ostringstream ss;
  Box local_3d8;
  int local_3bc;
  long *local_3b8;
  long local_3b0;
  long local_3a8 [2];
  ulong local_398;
  MFIter local_390;
  undefined1 local_330 [24];
  undefined8 auStack_318 [46];
  long local_1a8;
  undefined8 local_1a0 [13];
  ios_base local_138 [264];
  
  MFIter::MFIter(&local_390,&mf->super_FabArrayBase,'\0');
  if (local_390.currentIndex < local_390.endIndex) {
    this = (ostringstream *)(local_330 + 0x10);
    local_398 = (ulong)(uint)comp;
    local_3bc = comp;
    do {
      BATransformer::operator()
                ((Box *)local_330,&((local_390.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_390.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_390.currentIndex] * 0x1c +
                        *(long *)&((((local_390.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      local_3d8.smallend.vect[0] = local_330._0_4_ - ng->vect[0];
      local_3d8.smallend.vect[1] = local_330._4_4_ - ng->vect[1];
      local_3d8.smallend.vect[2] = local_330._8_4_ - ng->vect[2];
      local_3d8.bigend.vect[0] = ng->vect[0] + local_330._12_4_;
      local_3d8.bigend.vect[1] = ng->vect[1] + local_330._16_4_;
      local_3d8.bigend.vect[2] = ng->vect[2] + local_330._20_4_;
      local_3d8.btype.itype = auStack_318[0]._0_4_;
      if (((local_3d8.smallend.vect[0] <= cell->vect[0]) &&
          (local_3d8.smallend.vect[1] <= cell->vect[1])) &&
         ((cell->vect[2] <= local_3d8.bigend.vect[2] && local_3d8.smallend.vect[2] <= cell->vect[2])
          && (cell->vect[1] <= local_3d8.bigend.vect[1] && cell->vect[0] <= local_3d8.bigend.vect[0]
             ))) {
        cVar6 = (char)this;
        if (comp < 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0x11;
          iVar2 = (mf->super_FabArrayBase).n_comp;
          uVar1 = iVar2 - 1;
          if (1 < iVar2) {
            uVar11 = 0;
            do {
              piVar8 = &local_390.currentIndex;
              if (local_390.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar8 = ((local_390.local_index_map)->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + local_390.currentIndex;
              }
              pFVar5 = (mf->m_fabs_v).
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*piVar8];
              iVar2 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
              iVar9 = ((pFVar5->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1;
              iVar3 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 4);
              iVar4 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 8);
              iVar10 = (*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 4) - iVar3)
                       + 1;
              poVar7 = std::ostream::_M_insert<double>
                                 ((pFVar5->super_BaseFab<double>).dptr
                                  [((long)cell->vect[0] - (long)iVar2) +
                                   (long)(((cell->vect[2] - iVar4) * iVar10 +
                                          (cell->vect[1] - iVar3)) * iVar9) +
                                   (long)iVar9 * uVar11 *
                                   (long)((*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.
                                                           bigend + 8) - iVar4) + 1) * (long)iVar10]
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
          }
          piVar8 = &local_390.currentIndex;
          if (local_390.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar8 = ((local_390.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + local_390.currentIndex;
          }
          pFVar5 = (mf->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar8];
          iVar2 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
          iVar9 = ((pFVar5->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1;
          iVar3 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 4);
          iVar4 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 8);
          iVar10 = (*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 4) - iVar3) + 1;
          std::ostream::_M_insert<double>
                    ((pFVar5->super_BaseFab<double>).dptr
                     [((long)cell->vect[0] - (long)iVar2) +
                      (long)(((cell->vect[2] - iVar4) * iVar10 + (cell->vect[1] - iVar3)) * iVar9) +
                      (long)((*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 8) -
                             iVar4) + 1) * (long)iVar10 * (long)iVar9 * (long)(int)uVar1]);
          poVar7 = OutStream();
          local_330._0_4_ = -1;
          local_330._4_4_ = *(int *)(DAT_00842950 + -0x48);
          local_330._8_4_ = SUB84(poVar7,0);
          local_330._12_4_ = (undefined4)((ulong)poVar7 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(this);
          *(undefined8 *)
           ((long)auStack_318 + *(long *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)) =
               *(undefined8 *)
                ((long)CONCAT44(local_330._12_4_,local_330._8_4_) +
                *(long *)(*(long *)CONCAT44(local_330._12_4_,local_330._8_4_) + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," At cell ",9);
          comp = local_3bc;
          operator<<((ostream *)this,cell);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," in Box ",8);
          operator<<((ostream *)this,&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,(char *)local_3b8,local_3b0);
          std::ios::widen((char)*(undefined8 *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)
                          + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          if (local_3b8 != local_3a8) {
            operator_delete(local_3b8,local_3a8[0] + 1);
          }
          Print::~Print((Print *)local_330);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          poVar7 = OutStream();
          local_330._0_4_ = -1;
          local_330._4_4_ = *(int *)(DAT_00842950 + -0x48);
          local_330._8_4_ = SUB84(poVar7,0);
          local_330._12_4_ = (undefined4)((ulong)poVar7 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(this);
          *(undefined8 *)
           ((long)auStack_318 + *(long *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)) =
               *(undefined8 *)
                ((long)CONCAT44(local_330._12_4_,local_330._8_4_) +
                *(long *)(*(long *)CONCAT44(local_330._12_4_,local_330._8_4_) + -0x18) + 8);
          *(undefined8 *)
           ((long)auStack_318 + *(long *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)) =
               0x11;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," At cell ",9);
          operator<<((ostream *)this,cell);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," in Box ",8);
          operator<<((ostream *)this,&local_3d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
          piVar8 = &local_390.currentIndex;
          if (local_390.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar8 = ((local_390.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + local_390.currentIndex;
          }
          pFVar5 = (mf->m_fabs_v).
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*piVar8];
          iVar2 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
          iVar9 = ((pFVar5->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1;
          iVar3 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 4);
          iVar4 = *(int *)((long)&(pFVar5->super_BaseFab<double>).domain.smallend + 8);
          iVar10 = (*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 4) - iVar3) + 1;
          std::ostream::_M_insert<double>
                    ((pFVar5->super_BaseFab<double>).dptr
                     [((long)cell->vect[0] - (long)iVar2) +
                      (long)(((cell->vect[2] - iVar4) * iVar10 + (cell->vect[1] - iVar3)) * iVar9) +
                      (long)((*(int *)((long)&(pFVar5->super_BaseFab<double>).domain.bigend + 8) -
                             iVar4) + 1) * (long)iVar10 * (long)iVar9 * local_398]);
          std::ios::widen((char)*(undefined8 *)(CONCAT44(local_330._20_4_,local_330._16_4_) + -0x18)
                          + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          Print::~Print((Print *)local_330);
        }
      }
      MFIter::operator++(&local_390);
    } while (local_390.currentIndex < local_390.endIndex);
  }
  MFIter::~MFIter(&local_390);
  return;
}

Assistant:

void
printCell (FabArray<FAB> const& mf, const IntVect& cell, int comp = -1,
           const IntVect& ng = IntVect::TheZeroVector())
{
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        const Box& bx = amrex::grow(mfi.validbox(), ng);
        if (bx.contains(cell)) {
            if (comp >= 0) {
                amrex::AllPrint().SetPrecision(17) << " At cell " << cell << " in Box " << bx
                                                   << ": " << mf[mfi](cell, comp) << std::endl;
            } else {
                std::ostringstream ss;
                ss.precision(17);
                const int ncomp = mf.nComp();
                for (int i = 0; i < ncomp-1; ++i)
                {
                    ss << mf[mfi](cell,i) << ", ";
                }
                ss << mf[mfi](cell,ncomp-1);
                amrex::AllPrint() << " At cell " << cell << " in Box " << bx
                                  << ": " << ss.str() << std::endl;
            }
        }
    }
}